

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask23_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = in[1];
  vpmovsxbd_avx(ZEXT416(0x18141008));
  auVar5 = vpmovsxbd_avx(ZEXT416(0xd040009));
  *out = uVar1 << 0x17 | *in;
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar6 = vpshufd_avx(auVar8,0x94);
  auVar6 = vpinsrd_avx(auVar6,uVar1,0);
  auVar3 = vpinsrd_avx(auVar6,in[3] << 5,1);
  auVar4 = vpinsrd_avx(auVar5,auVar8._0_4_ >> 0x12,1);
  auVar7 = vpsrlvd_avx2(auVar6,auVar5);
  auVar5 = vpsllvd_avx2(auVar8,_DAT_001a60c0);
  uVar2 = in[7];
  auVar6 = vpor_avx(auVar3,auVar4);
  auVar6 = vpblendd_avx2(auVar7,auVar6,2);
  auVar6 = vpor_avx(auVar5,auVar6);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  out[5] = uVar2 * 2 | auVar8._12_4_ >> 0x16;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask23_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (23 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (23 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (23 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (23 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (23 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;

  return out + 1;
}